

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O0

void cjson_add_false_should_fail_with_null_pointers(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *root;
  
  object = cJSON_CreateObject();
  pcVar1 = cJSON_AddFalseToObject((cJSON *)0x0,"false");
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0xb5);
  }
  pcVar1 = cJSON_AddFalseToObject(object,(char *)0x0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0xb6);
  }
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_false_should_fail_with_null_pointers(void)
{
    cJSON *root = cJSON_CreateObject();

    TEST_ASSERT_NULL(cJSON_AddFalseToObject(NULL, "false"));
    TEST_ASSERT_NULL(cJSON_AddFalseToObject(root, NULL));

    cJSON_Delete(root);
}